

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall CMU462::EdgeRecord::EdgeRecord(EdgeRecord *this,EdgeIter *_edge)

{
  pointer this_00;
  HalfedgeIter *pHVar1;
  pointer pHVar2;
  VertexIter *pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  Vector3D local_2b8;
  double local_2a0;
  Vector3D local_298;
  Vector3D local_280;
  double local_268;
  Vector3D local_260;
  Vector3D local_248;
  Vector3D local_230;
  double local_218;
  double c1;
  double local_1f8;
  double c0;
  undefined1 local_1d8 [8];
  Vector3D p1;
  Vector3D p0;
  Vector3D local_160;
  undefined1 local_148 [8];
  Vector3D b;
  Matrix3x3 A;
  double A_data [9];
  Matrix4x4 K;
  HalfedgeIter h;
  EdgeIter *_edge_local;
  EdgeRecord *this_local;
  
  (this->edge)._M_node = _edge->_M_node;
  Vector3D::Vector3D(&this->optimalPoint);
  this->score = 0.0;
  this_00 = std::_List_iterator<CMU462::Edge>::operator->(&this->edge);
  pHVar1 = Edge::halfedge(this_00);
  K.entries[3].w = (double)pHVar1->_M_node;
  pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)&K.entries[3].w);
  pVVar3 = Halfedge::vertex(pHVar2);
  pVVar4 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar3);
  pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)&K.entries[3].w);
  pHVar1 = Halfedge::twin(pHVar2);
  pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar1);
  pVVar3 = Halfedge::vertex(pHVar2);
  pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar3);
  Matrix4x4::operator+((Matrix4x4 *)(A_data + 8),&pVVar4->quadric,&pVVar5->quadric);
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),0,0);
  A.entries[2].z = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),0,1);
  A_data[0] = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),0,2);
  A_data[1] = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),1,0);
  A_data[2] = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),1,1);
  A_data[3] = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),1,2);
  A_data[4] = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),2,0);
  A_data[5] = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),2,1);
  A_data[6] = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),2,2);
  A_data[7] = *pdVar6;
  Matrix3x3::Matrix3x3((Matrix3x3 *)&b.z,&A.entries[2].z);
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),0,3);
  dVar7 = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),1,3);
  dVar8 = *pdVar6;
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),2,3);
  Vector3D::Vector3D((Vector3D *)local_148,-dVar7,-dVar8,-*pdVar6);
  dVar7 = Matrix3x3::det((Matrix3x3 *)&b.z);
  if (dVar7 <= 0.01) {
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)&K.entries[3].w);
    pVVar3 = Halfedge::vertex(pHVar2);
    pVVar4 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar3);
    Vector3D::Vector3D((Vector3D *)&p1.z,&pVVar4->position);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)&K.entries[3].w);
    pHVar1 = Halfedge::twin(pHVar2);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar1);
    pVVar3 = Halfedge::vertex(pHVar2);
    pVVar4 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar3);
    Vector3D::Vector3D((Vector3D *)local_1d8,&pVVar4->position);
    while( true ) {
      Vector3D::operator-((Vector3D *)&c0,(Vector3D *)&p1.z,(Vector3D *)local_1d8);
      dVar7 = Vector3D::norm2((Vector3D *)&c0);
      if (dVar7 <= 0.0001) break;
      Matrix3x3::operator*((Vector3D *)&c1,(Matrix3x3 *)&b.z,(Vector3D *)&p1.z);
      dVar7 = dot((Vector3D *)&p1.z,(Vector3D *)&c1);
      dVar8 = dot((Vector3D *)local_148,(Vector3D *)&p1.z);
      local_1f8 = dVar7 - (dVar8 + dVar8);
      Matrix3x3::operator*(&local_230,(Matrix3x3 *)&b.z,(Vector3D *)local_1d8);
      dVar7 = dot((Vector3D *)local_1d8,&local_230);
      dVar8 = dot((Vector3D *)local_148,(Vector3D *)local_1d8);
      local_218 = dVar7 - (dVar8 + dVar8);
      if (local_1f8 <= local_218) {
        Vector3D::operator+(&local_298,(Vector3D *)&p1.z,(Vector3D *)local_1d8);
        local_2a0 = 2.0;
        Vector3D::operator/(&local_280,&local_298,&local_2a0);
        local_1d8 = (undefined1  [8])local_280.x;
        p1.x = local_280.y;
        p1.y = local_280.z;
      }
      else {
        Vector3D::operator+(&local_260,(Vector3D *)&p1.z,(Vector3D *)local_1d8);
        local_268 = 2.0;
        Vector3D::operator/(&local_248,&local_260,&local_268);
        p1.z = local_248.x;
        p0.x = local_248.y;
        p0.y = local_248.z;
      }
    }
    (this->optimalPoint).x = p1.z;
    (this->optimalPoint).y = p0.x;
    (this->optimalPoint).z = p0.y;
  }
  else {
    Matrix3x3::inv((Matrix3x3 *)&p0.z,(Matrix3x3 *)&b.z);
    Matrix3x3::operator*(&local_160,(Matrix3x3 *)&p0.z,(Vector3D *)local_148);
    (this->optimalPoint).x = local_160.x;
    (this->optimalPoint).y = local_160.y;
    (this->optimalPoint).z = local_160.z;
  }
  Matrix3x3::operator*(&local_2b8,(Matrix3x3 *)&b.z,&this->optimalPoint);
  dVar7 = dot(&this->optimalPoint,&local_2b8);
  dVar8 = dot((Vector3D *)local_148,&this->optimalPoint);
  pdVar6 = Matrix4x4::operator()((Matrix4x4 *)(A_data + 8),3,3);
  this->score = (dVar7 - (dVar8 + dVar8)) + *pdVar6;
  return;
}

Assistant:

EdgeRecord::EdgeRecord(EdgeIter& _edge) : edge(_edge) {
  // Compute the combined quadric from the edge endpoints.

  auto h = edge->halfedge();
  auto K = h->vertex()->quadric + h->twin()->vertex()->quadric;

  // -> Build the 3x3 linear system whose solution minimizes the quadric error
  //    associated with these two endpoints.

  double A_data[9] = { K(0,0), K(0,1), K(0,2),
                       K(1,0), K(1,1), K(1,2),
                       K(2,0), K(2,1), K(2,2) };
  auto A = Matrix3x3(A_data);
  auto b = Vector3D(-K(0,3), -K(1,3), -K(2,3));

  // -> Use this system to solve for the optimal position, and store it in
  //    EdgeRecord::optimalPoint.

  if (A.det() > 0.01) {
    optimalPoint = A.inv() * b;
  } else {
//    cerr << "detA is too small: " << A.det() << endl;
//    cerr << "inverse answer: " << A.inv() * b << endl;

    auto p0 = h->vertex()->position, p1 = h->twin()->vertex()->position;
    while ((p0 - p1).norm2() > 0.0001) {
      auto c0 = dot(p0, A * p0) - 2 * dot(b, p0),
           c1 = dot(p1, A * p1) - 2 * dot(b, p1);
      if (c0 > c1) {
        p0 = (p0 + p1) / 2;
      } else {
        p1 = (p0 + p1) / 2;
      }
    }
    optimalPoint = p0;

//    cerr << "actual answer: " << optimalPoint << endl << endl;
  }

  // -> Also store the cost associated with collapsing this edg in
  //    EdgeRecord::Cost.

  score = dot(optimalPoint, A * optimalPoint) - 2 * dot(b, optimalPoint) + K(3,3);
}